

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

void __thiscall
cfd::core::ScriptWitness::SetWitnessStack(ScriptWitness *this,uint32_t index,ByteData *data)

{
  pointer pBVar1;
  CfdException *this_00;
  ulong uVar2;
  ulong uVar3;
  uint32_t local_44;
  undefined1 local_40 [32];
  
  pBVar1 = (this->witness_stack_).
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->witness_stack_).
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) *
          -0x5555555555555555;
  uVar2 = (ulong)index;
  local_44 = index;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pBVar1 + uVar2),
               &data->data_);
    return;
  }
  local_40._0_8_ = "cfdcore_transaction_common.cpp";
  local_40._8_4_ = 0x32;
  local_40._16_8_ = "SetWitnessStack";
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"WitnessStack[{}] out_of_range.",
             &local_44);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"vin out_of_range error.","")
  ;
  CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ScriptWitness::SetWitnessStack(uint32_t index, const ByteData &data) {
  if (witness_stack_.size() <= index) {
    warn(CFD_LOG_SOURCE, "WitnessStack[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
  witness_stack_[index] = data;
}